

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cpp
# Opt level: O2

void __thiscall
cs222::Instruction::Instruction
          (Instruction *this,size_t *lineNumber,string *line,string *label,string *operation,
          Operand *firstOperand,Operand *secondOperand,string *operandsToken,string *comment,
          bitset<6UL> *flags)

{
  this->lineNumber = *lineNumber;
  std::__cxx11::string::string((string *)&this->line,(string *)line);
  this->commentLine = false;
  std::__cxx11::string::string((string *)&this->label,(string *)label);
  std::__cxx11::string::string((string *)&this->operation,(string *)operation);
  std::pair<cs222::Operand,_cs222::Operand>::pair<cs222::Operand,_cs222::Operand,_true>
            (&this->operands,firstOperand,secondOperand);
  std::__cxx11::string::string((string *)&this->operandsToken,(string *)operandsToken);
  std::__cxx11::string::string((string *)&this->comment,(string *)comment);
  (this->flags).super__Base_bitset<1UL>._M_w = (flags->super__Base_bitset<1UL>)._M_w;
  (this->errors).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->errors).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->errors).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->warnings).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->warnings).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->warnings).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

Instruction::Instruction(
            const size_t& lineNumber,
            const std::string& line,
            const std::string& label,
            const std::string& operation,
            const Operand& firstOperand,
            const Operand& secondOperand,
            const std::string& operandsToken,
            const std::string& comment,
            const std::bitset<6>& flags) :
        lineNumber(lineNumber), line(line), commentLine(false),
        label(label), operation(operation),
        operands(Operand_pair(firstOperand, secondOperand)),
        operandsToken(operandsToken), comment(comment), flags(flags) { }